

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void * nn_reallocmsg(void *msg,size_t size)

{
  int iVar1;
  int *piVar2;
  void *in_RDI;
  int rc;
  undefined8 local_8;
  
  iVar1 = nn_chunk_realloc((size_t)msg,(void **)size);
  local_8 = in_RDI;
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *nn_reallocmsg (void *msg, size_t size)
{
    int rc;

    rc = nn_chunk_realloc (size, &msg);
    if (rc == 0)
        return msg;
    errno = -rc;
    return NULL;
}